

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
google::protobuf::Arena::
Create<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>(Arena *arena)

{
  Arena *arena_local;
  _func_void_void_ptr *destructor;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  if (arena == (Arena *)0x0) {
    local_10 = (Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x28);
    memset(local_10,0,0x28);
    internal::InternalMetadata::
    Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Container(local_10);
  }
  else {
    local_10 = (Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)AllocateInternal(arena,0x28,8,
                                   internal::
                                   arena_destruct_object<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                                   ,(type_info *)
                                    &internal::InternalMetadata::Container<std::__cxx11::string>::
                                     typeinfo);
    memset(local_10,0,0x28);
    internal::InternalMetadata::
    Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Container(local_10);
  }
  return local_10;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* Create(Arena* arena, Args&&... args) {
    return CreateInternal<T>(arena, std::is_convertible<T*, MessageLite*>(),
                             static_cast<Args&&>(args)...);
  }